

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O2

bool stl_reader::StlFileHasASCIIFormat(char *filename)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *this;
  size_type sVar5;
  string local_3d0 [32];
  string firstWord;
  ifstream in;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&in,filename,_S_in);
  if ((abStack_208[*(long *)(_in + -0x18)] & 5) == 0) {
    firstWord._M_dataplus._M_p = (pointer)&firstWord.field_2;
    firstWord._M_string_length = 0;
    firstWord.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&in,(string *)&firstWord);
    sVar2 = firstWord._M_string_length;
    _Var1._M_p = firstWord._M_dataplus._M_p;
    for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
      iVar3 = tolower((int)_Var1._M_p[sVar5]);
      _Var1._M_p[sVar5] = (char)iVar3;
    }
    iVar3 = std::__cxx11::string::compare((char *)&firstWord);
    std::__cxx11::string::~string((string *)&firstWord);
    std::ifstream::~ifstream(&in);
    return iVar3 == 0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&firstWord);
  poVar4 = std::operator<<((ostream *)firstWord.field_2._M_local_buf,"Couldnt open file ");
  std::operator<<(poVar4,filename);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_3d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool StlFileHasASCIIFormat(const char* filename)
{
	using namespace std;
	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	string firstWord;
	in >> firstWord;
	transform(firstWord.begin(), firstWord.end(), firstWord.begin(), ::tolower);

	return firstWord.compare("solid") == 0;
}